

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifyon(bifcxdef *ctx,int argc)

{
  int iVar1;
  int iVar2;
  ushort **ppuVar3;
  size_t sVar4;
  undefined8 *in_RDI;
  bool bVar5;
  int match_no;
  int match_yes;
  re_context rectx;
  char nobuf [64];
  char yesbuf [64];
  runsdef val;
  char *p;
  char rsp [128];
  undefined4 in_stack_fffffffffffffda8;
  int in_stack_fffffffffffffdac;
  runcxdef *in_stack_fffffffffffffdb0;
  runsdef *val_00;
  char *in_stack_fffffffffffffdb8;
  dattyp typ;
  int in_stack_fffffffffffffdc0;
  runcxdef *ctx_00;
  re_context *in_stack_fffffffffffffdc8;
  re_context *ctx_01;
  char *in_stack_fffffffffffffdd0;
  char *in_stack_fffffffffffffdd8;
  re_context local_210;
  undefined1 local_138 [304];
  undefined8 *local_8;
  
  local_8 = in_RDI;
  iVar1 = os_get_str_rsc(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                         (size_t)in_stack_fffffffffffffdb0);
  if (iVar1 != 0) {
    strcpy(local_138 + 0x40,"[Yy].*");
  }
  iVar1 = os_get_str_rsc(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                         (size_t)in_stack_fffffffffffffdb0);
  if (iVar1 != 0) {
    strcpy(local_138,"[Nn].*");
  }
  iVar1 = tio_is_html_mode();
  if (iVar1 != 0) {
    outformat((char *)in_stack_fffffffffffffdb0);
  }
  outflushn(0);
  outreset();
  iVar1 = getstring(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                    (int)((ulong)in_stack_fffffffffffffdc8 >> 0x20));
  if (iVar1 == 0) {
    iVar1 = tio_is_html_mode();
    if (iVar1 != 0) {
      outformat((char *)in_stack_fffffffffffffdb0);
    }
    local_138._152_8_ = local_138 + 0xa0;
    while( true ) {
      bVar5 = false;
      if (*(byte *)(errcxdef **)local_138._152_8_ < 0x80) {
        ppuVar3 = __ctype_b_loc();
        bVar5 = ((*ppuVar3)[(int)(uint)*(byte *)(errcxdef **)local_138._152_8_] & 0x2000) != 0;
      }
      if (!bVar5) break;
      local_138._152_8_ = (long)(errcxdef **)local_138._152_8_ + 1;
    }
    re_init(&local_210,(errcxdef *)*local_8);
    val_00 = (runsdef *)(local_138 + 0x40);
    sVar4 = strlen(local_138 + 0x40);
    ctx_00 = (runcxdef *)local_138._152_8_;
    strlen((char *)local_138._152_8_);
    iVar1 = re_compile_and_match
                      (in_stack_fffffffffffffdc8,(char *)ctx_00,sVar4,(char *)val_00,
                       CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    ctx_01 = (re_context *)local_138;
    strlen(local_138);
    strlen((char *)local_138._152_8_);
    iVar2 = re_compile_and_match
                      (ctx_01,(char *)ctx_00,sVar4,(char *)val_00,
                       CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    typ = (dattyp)(sVar4 >> 0x20);
    sVar4 = strlen((char *)local_138._152_8_);
    if (iVar1 == (int)sVar4) {
      local_138._144_8_ = (char *)0x1;
    }
    else {
      sVar4 = strlen((char *)local_138._152_8_);
      if (iVar2 == (int)sVar4) {
        local_138._144_8_ = (char *)0x0;
      }
      else {
        local_138._144_8_ = (char *)0xffffffffffffffff;
      }
    }
    re_delete((re_context *)0x135ed8);
    runpush(ctx_00,typ,val_00);
    return;
  }
  *(undefined4 *)(**(long **)local_8[1] + 0x68) = 0;
  runsign(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
}

Assistant:

void bifyon(bifcxdef *ctx, int argc)
{
    char     rsp[128];
    char    *p;
    runsdef  val;
    char     yesbuf[64];
    char     nobuf[64];
    re_context  rectx;
    int      match_yes;
    int      match_no;

    bifcntargs(ctx, 0, argc);            /* check for proper argument count */

    /* load the "yes" and "no" reply patterns */
    if (os_get_str_rsc(RESID_YORN_YES, yesbuf, sizeof(yesbuf)))
        strcpy(yesbuf, "[Yy].*");
    if (os_get_str_rsc(RESID_YORN_NO, nobuf, sizeof(nobuf)))
        strcpy(nobuf, "[Nn].*");
    
    /* if we're in HTML mode, switch to input font */
    if (tio_is_html_mode())
        tioputs(ctx->bifcxtio, "<font face='TADS-Input'>");

    /* ensure the prompt is displayed */
    tioflushn(ctx->bifcxtio, 0);

    /* reset count of lines since the last keyboard input */
    tioreset(ctx->bifcxtio);

    /* read a line of text */
    if (tiogets(ctx->bifcxtio, (char *)0, rsp, (int)sizeof(rsp)))
        runsig(ctx->bifcxrun, ERR_RUNQUIT);

    /* if we're in HTML mode, close the input font tag */
    if (tio_is_html_mode())
        tioputs(ctx->bifcxtio, "</font>");

    /* scan off leading spaces */
    for (p = rsp ; t_isspace(*p) ; ++p) ;

    /* set up our regex context */
    re_init(&rectx, ctx->bifcxerr);

    /* check for a "yes" response */
    match_yes = re_compile_and_match(&rectx, yesbuf, strlen(yesbuf),
                                     p, strlen(p));

    /* check for a "no" response */
    match_no = re_compile_and_match(&rectx, nobuf, strlen(nobuf),
                                    p, strlen(p));

    /* check the result */
    if (match_yes == (int)strlen(p))
        val.runsv.runsvnum = 1;
    else if (match_no == (int)strlen(p))
        val.runsv.runsvnum = 0;
    else
        val.runsv.runsvnum = -1;

    /* delete our regex context */
    re_delete(&rectx);

    /* push the result */
    runpush(ctx->bifcxrun, DAT_NUMBER, &val);
}